

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonpath::
parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>::
parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>&>
          (parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,value_or_pointer<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *data)

{
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RSI;
  value_or_pointer<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RDI;
  
  value_or_pointer<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::value_or_pointer(in_RDI,(pointer)0x0);
  in_RDI->is_value_ = (bool)((byte)(in_RSI->field_0).json_const_pointer_ & 1);
  if (((byte)(in_RSI->field_0).json_const_pointer_ & 1) == 0) {
    (in_RDI->field_1).ptr_ = (pointer)(in_RSI->field_0).int64_.val_;
  }
  else {
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::operator=
              (in_RSI,(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI)
    ;
  }
  return;
}

Assistant:

parameter(value_or_pointer<Json,JsonReference>&& data) noexcept
        {
            data_.is_value_ = data.is_value_;
            if (data.is_value_)
            {
                data_.val_ = std::move(data.val_);
            }
            else
            {
                data_.ptr_ = data.ptr_;
            }
        }